

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

lua_State * lua_newstate(lua_Alloc f,void *ud)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  LG *l;
  global_State *g;
  lua_State *L;
  int i;
  void *ud_local;
  lua_Alloc f_local;
  
  pvVar3 = (*f)(ud,(void *)0x0,8,0x610);
  if (pvVar3 == (void *)0x0) {
    f_local = (lua_Alloc)0x0;
  }
  else {
    g = (global_State *)((long)pvVar3 + 8);
    g->frealloc = (lua_Alloc)0x0;
    *(undefined1 *)((long)pvVar3 + 0x10) = 8;
    *(undefined1 *)((long)pvVar3 + 300) = 1;
    *(byte *)((long)pvVar3 + 0x11) = *(byte *)((long)pvVar3 + 300) & 3;
    preinit_thread((lua_State *)g,(global_State *)((long)pvVar3 + 0xd8));
    ((global_State *)((long)pvVar3 + 0xd8))->frealloc = f;
    *(void **)((long)pvVar3 + 0xe0) = ud;
    *(global_State **)((long)pvVar3 + 0x1a0) = g;
    uVar1 = makeseed((lua_State *)g);
    *(uint *)((long)pvVar3 + 0x128) = uVar1;
    *(undefined1 *)((long)pvVar3 + 0x12f) = 0;
    *(undefined8 *)((long)pvVar3 + 0x100) = 0;
    *(undefined4 *)((long)pvVar3 + 0x110) = 0;
    *(undefined4 *)((long)pvVar3 + 0x114) = 0;
    *(undefined8 *)((long)pvVar3 + 0x108) = 0;
    *(undefined4 *)((long)pvVar3 + 0x120) = 0;
    *(undefined8 *)((long)pvVar3 + 0x198) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1a8) = 0;
    *(undefined1 *)((long)pvVar3 + 0x12d) = 7;
    *(undefined1 *)((long)pvVar3 + 0x12e) = 0;
    *(undefined8 *)((long)pvVar3 + 0x178) = 0;
    *(undefined8 *)((long)pvVar3 + 0x170) = 0;
    *(undefined8 *)((long)pvVar3 + 0x140) = 0;
    *(undefined8 *)((long)pvVar3 + 0x130) = 0;
    *(undefined8 *)((long)pvVar3 + 0x138) = 0;
    *(undefined8 *)((long)pvVar3 + 0x150) = 0;
    *(undefined8 *)((long)pvVar3 + 0x148) = 0;
    *(undefined8 *)((long)pvVar3 + 0x168) = 0;
    *(undefined8 *)((long)pvVar3 + 0x160) = 0;
    *(undefined8 *)((long)pvVar3 + 0x158) = 0;
    *(undefined8 *)((long)pvVar3 + 0x180) = 0;
    *(undefined8 *)((long)pvVar3 + 0xe8) = 0x610;
    *(undefined8 *)((long)pvVar3 + 0xf0) = 0;
    *(undefined4 *)((long)pvVar3 + 0x188) = 0;
    *(undefined4 *)((long)pvVar3 + 0x18c) = 200;
    *(undefined4 *)((long)pvVar3 + 400) = 200;
    for (L._4_4_ = 0; L._4_4_ < 9; L._4_4_ = L._4_4_ + 1) {
      *(undefined8 *)((long)pvVar3 + (long)L._4_4_ * 8 + 0x278) = 0;
    }
    iVar2 = luaD_rawrunprotected((lua_State *)g,f_luaopen,(void *)0x0);
    if (iVar2 != 0) {
      close_state((lua_State *)g);
      g = (global_State *)0x0;
    }
    f_local = (lua_Alloc)g;
  }
  return (lua_State *)f_local;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud) {
  int i;
  lua_State *L;
  global_State *g;
  LG *l = cast(LG *, (*f)(ud, NULL, LUA_TTHREAD, sizeof(LG)));
  if (l == NULL) return NULL;
  L = &l->l.l;
  g = &l->g;
  L->next = NULL;
  L->tt = LUA_TTHREAD;
  g->currentwhite = bitmask(WHITE0BIT);
  L->marked = luaC_white(g);
  preinit_thread(L, g);
  g->frealloc = f;
  g->ud = ud;
  g->mainthread = L;
  g->seed = makeseed(L);
  g->gcrunning = 0;  /* no GC while building state */
  g->GCestimate = 0;
  g->strt.size = g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(&g->l_registry);
  g->panic = NULL;
  g->version = NULL;
  g->gcstate = GCSpause;
  g->gckind = KGC_NORMAL;
  g->allgc = g->finobj = g->tobefnz = g->fixedgc = NULL;
  g->sweepgc = NULL;
  g->gray = g->grayagain = NULL;
  g->weak = g->ephemeron = g->allweak = NULL;
  g->twups = NULL;
  g->totalbytes = sizeof(LG);
  g->GCdebt = 0;
  g->gcfinnum = 0;
  g->gcpause = LUAI_GCPAUSE;
  g->gcstepmul = LUAI_GCMUL;
  for (i=0; i < LUA_NUMTAGS; i++) g->mt[i] = NULL;
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != LUA_OK) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
  return L;
}